

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,ChannelMask *aChannelMask)

{
  bool bVar1;
  ulong uVar2;
  ByteArray *aBytes;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  ChannelMaskEntry *entry;
  const_iterator __end2;
  const_iterator __begin2;
  ChannelMask *__range2;
  ChannelMask *aChannelMask_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::
           vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           ::begin((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                    *)this);
  entry = (ChannelMaskEntry *)
          std::
          vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ::end((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                 *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
                                     *)&entry), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
               ::operator*(&__end2);
    std::__cxx11::to_string(&local_a0,(uint)local_40->mPage);
    std::operator+(&local_80,"page=",&local_a0);
    std::operator+(&local_60,&local_80,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    utils::Hex_abi_cxx11_(&local_110,(utils *)&local_40->mMasks,aBytes);
    std::operator+(&local_f0,"masks=",&local_110);
    std::operator+(&local_d0,&local_f0,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    __gnu_cxx::
    __normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
    ::operator++(&__end2);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const ChannelMask &aChannelMask)
{
    std::string ret;
    for (const auto &entry : aChannelMask)
    {
        ret += "page=" + std::to_string(entry.mPage) + "\n";
        ret += "masks=" + utils::Hex(entry.mMasks) + "\n";
    }
    if (!ret.empty())
    {
        ret.pop_back();
    }
    return ret;
}